

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

char * __thiscall Assimp::CFIReaderImpl::getAttributeValue(CFIReaderImpl *this,int idx)

{
  pointer pAVar1;
  element_type *peVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  
  if (-1 < idx) {
    pAVar1 = (this->attributes).
             super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
    if (idx < (int)(lVar4 / 0x90)) {
      peVar2 = pAVar1[(uint)idx].value.
               super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar3 = (**peVar2->_vptr_FIValue)(peVar2,idx,lVar4 % 0x90);
      return *(char **)CONCAT44(extraout_var,iVar3);
    }
  }
  return (char *)0x0;
}

Assistant:

virtual const char* getAttributeValue(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return nullptr;
        }
        return attributes[idx].value->toString().c_str();
    }